

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_paste(Nvim *this,string *data,bool crlf,Integer phase)

{
  allocator local_52;
  bool local_51;
  Integer local_50;
  string local_48;
  
  local_51 = crlf;
  local_50 = phase;
  std::__cxx11::string::string((string *)&local_48,"nvim_paste",&local_52);
  NvimRPC::async_call<std::__cxx11::string,bool,long>
            (&this->client_,&local_48,data,&local_51,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::async_paste(const std::string& data, bool crlf, Integer phase) {
    client_.async_call("nvim_paste", data, crlf, phase);
}